

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_offset_datetime_abi_cxx11_
          (result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  source_ptr *this_00;
  local_date lVar1;
  const_iterator rollback;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  value_type *pvVar6;
  value_type *pvVar7;
  syntax_error *this_01;
  internal_error *piVar8;
  location *loc_00;
  ushort uVar9;
  location *loc_01;
  pair<toml::offset_datetime,_toml::detail::region> *this_02;
  ushort uVar10;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  allocator<char> local_33a;
  allocator_type local_339;
  string str;
  string local_318;
  string local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  undefined1 local_2c0 [112];
  location inner_loc;
  undefined1 local_208 [80];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  source_location local_1a0;
  result<toml::detail::region,_toml::detail::none_t> ofs;
  string local_f8;
  result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  datetime;
  result<toml::detail::region,_toml::detail::none_t> token;
  
  rollback._M_current = *(char **)(this + 0x40);
  sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<4UL>_>,_toml::detail::character<'-'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<'-'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>,_toml::detail::either<toml::detail::character<'T'>,_toml::detail::character<'t'>,_toml::detail::character<'_'>_>,_toml::detail::sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::maybe<toml::detail::sequence<toml::detail::character<'.'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::at_least<1UL>_>_>_>_>,_toml::detail::either<toml::detail::character<'Z'>,_toml::detail::character<'z'>,_toml::detail::sequence<toml::detail::either<toml::detail::character<'+'>,_toml::detail::character<'-'>_>,_toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>_>_>_>_>
  ::invoke(&token,(location *)this);
  if (token.is_ok_ == true) {
    std::__cxx11::string::string((string *)&local_f8,(string *)(this + 0x20));
    pvVar6 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
    region::str_abi_cxx11_((string *)local_2c0,pvVar6);
    location::location(&inner_loc,&local_f8,(string *)local_2c0);
    std::__cxx11::string::~string((string *)local_2c0);
    std::__cxx11::string::~string((string *)&local_f8);
    parse_local_datetime_abi_cxx11_(&datetime,(detail *)&inner_loc,loc_00);
    if ((datetime.is_ok_ != true) ||
       (inner_loc.iter_._M_current ==
        ((inner_loc.source_.
          super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish)) {
      piVar8 = (internal_error *)__cxa_allocate_exception(0x78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&str,"toml::parse_offset_datetime: invalid datetime format",
                 (allocator<char> *)&local_2d8);
      source_location::source_location((source_location *)&ofs,&inner_loc);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[19],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_2c0,(source_location *)&ofs,(char (*) [19])"date, not datetime");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_2c0;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_318,__l_00,(allocator_type *)&local_1b8);
      local_2f8._M_dataplus._M_p = (pointer)0x0;
      local_2f8._M_string_length = 0;
      local_2f8.field_2._M_allocated_capacity = 0;
      format_underline((string *)&local_1a0,&str,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_318,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_2f8,false);
      source_location::source_location((source_location *)local_208,&inner_loc);
      internal_error::internal_error(piVar8,(string *)&local_1a0,(source_location *)local_208);
      __cxa_throw(piVar8,&internal_error::typeinfo,internal_error::~internal_error);
    }
    loc_01 = &inner_loc;
    sequence<toml::detail::either<toml::detail::character<'+'>,_toml::detail::character<'-'>_>,_toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>_>
    ::invoke(&ofs,loc_01);
    if (ofs.is_ok_ == true) {
      pvVar6 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&ofs);
      region::str_abi_cxx11_(&str,pvVar6);
      std::__cxx11::string::substr((ulong)local_2c0,(ulong)&str);
      uVar4 = from_string<int>((string *)local_2c0,0);
      std::__cxx11::string::~string((string *)local_2c0);
      std::__cxx11::string::substr((ulong)local_2c0,(ulong)&str);
      loc_01 = (location *)0x0;
      uVar5 = from_string<int>((string *)local_2c0,0);
      std::__cxx11::string::~string((string *)local_2c0);
      if ((0x17 < uVar4) || (0x3b < uVar5)) {
        this_01 = (syntax_error *)__cxa_allocate_exception(0x78);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,
                   "toml::parse_offset_datetime: invalid offset: it does not conform RFC3339.",
                   &local_33a);
        source_location::source_location((source_location *)local_208,(location *)this);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[78],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_2c0,(source_location *)local_208,
                   (char (*) [78])
                   "month should be 01-12, day should be 01-28,29,30,31, depending on month/year.");
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)local_2c0;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_2d8,__l_01,&local_339);
        local_1b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline(&local_318,&local_2f8,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_2d8,&local_1b8,false);
        source_location::source_location(&local_1a0,&inner_loc);
        syntax_error::syntax_error(this_01,&local_318,&local_1a0);
        __cxa_throw(this_01,&syntax_error::typeinfo,syntax_error::~syntax_error);
      }
      uVar2 = -uVar5;
      uVar3 = -uVar4;
      if (*str._M_dataplus._M_p == '+') {
        uVar2 = uVar5;
        uVar3 = uVar4;
      }
      std::__cxx11::string::~string((string *)&str);
      uVar10 = (ushort)(uVar2 << 8);
      uVar9 = (ushort)uVar3 & 0xff;
    }
    else {
      if ((byte)(*inner_loc.iter_._M_current | 0x20U) != 0x7a) {
        piVar8 = (internal_error *)__cxa_allocate_exception(0x78);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_318,"toml::parse_offset_datetime: invalid datetime format",
                   (allocator<char> *)&local_1b8);
        source_location::source_location((source_location *)local_208,&inner_loc);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[26],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_2c0,(source_location *)local_208,
                   (char (*) [26])"should be `Z` or `+HH:MM`");
        __l_02._M_len = 1;
        __l_02._M_array = (iterator)local_2c0;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_2f8,__l_02,(allocator_type *)&local_33a);
        local_2d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline(&str,&local_318,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_2f8,&local_2d8,false);
        source_location::source_location(&local_1a0,&inner_loc);
        internal_error::internal_error(piVar8,&str,&local_1a0);
        __cxa_throw(piVar8,&internal_error::typeinfo,internal_error::~internal_error);
      }
      uVar9 = 0;
      uVar10 = 0;
    }
    result<toml::detail::region,_toml::detail::none_t>::cleanup(&ofs,(EVP_PKEY_CTX *)loc_01);
    pvVar7 = result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap(&datetime);
    lVar1 = (pvVar7->first).date;
    local_208._8_2_ = (pvVar7->first).time.nanosecond;
    local_208._0_8_ = *(undefined8 *)&(pvVar7->first).time;
    pvVar6 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
    ofs.field_1._6_2_ = uVar9 | uVar10;
    this_00 = &ofs.field_1.succ.value.source_;
    ofs._4_4_ = SUB84(local_208._0_8_,0);
    ofs.field_1._0_4_ = SUB84(local_208._0_8_,4);
    ofs.field_1._4_2_ = local_208._8_2_;
    ofs._0_4_ = lVar1;
    region::region((region *)this_00,pvVar6);
    this_02 = (pair<toml::offset_datetime,_toml::detail::region> *)local_2c0;
    std::pair<toml::offset_datetime,_toml::detail::region>::pair
              (this_02,(pair<toml::offset_datetime,_toml::detail::region> *)&ofs);
    result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,(success_type *)this_02);
    region::~region((region *)(local_2c0 + 0x10));
    region::~region((region *)this_00);
    result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup(&datetime,(EVP_PKEY_CTX *)this_02);
    location::~location(&inner_loc);
  }
  else {
    location::reset((location *)this,rollback);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"toml::parse_offset_datetime: ",(allocator<char> *)&local_318);
    source_location::source_location((source_location *)&datetime,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[40],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2c0,(source_location *)&datetime,
               (char (*) [40])"the next token is not a offset_datetime");
    __l._M_len = 1;
    __l._M_array = (iterator)local_2c0;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&inner_loc,__l,(allocator_type *)&local_2f8);
    str._M_dataplus._M_p = (pointer)0x0;
    str._M_string_length = 0;
    str.field_2._M_allocated_capacity = 0;
    format_underline((string *)local_208,(string *)&local_1a0,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&inner_loc,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&str,false);
    ofs._0_8_ = local_208._0_8_;
    if ((undefined1 *)local_208._0_8_ == local_208 + 0x10) {
      ofs.field_1.succ.value.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)local_208._24_8_;
      ofs._0_8_ = (pointer)((long)&ofs.field_1 + 8);
    }
    ofs.field_1._0_4_ = (undefined4)local_208._8_8_;
    ofs.field_1._4_2_ = SUB82(local_208._8_8_,4);
    ofs.field_1._6_2_ = SUB82(local_208._8_8_,6);
    local_208._8_8_ = 0;
    local_208[0x10] = '\0';
    this_02 = (pair<toml::offset_datetime,_toml::detail::region> *)&ofs;
    local_208._0_8_ = local_208 + 0x10;
    result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,(failure_type *)&ofs);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::string::~string((string *)local_208);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&str);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&inner_loc);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_2c0);
    source_location::~source_location((source_location *)&datetime);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  result<toml::detail::region,_toml::detail::none_t>::cleanup(&token,(EVP_PKEY_CTX *)this_02);
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<offset_datetime, region>, std::string>
parse_offset_datetime(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_offset_date_time::invoke(loc))
    {
        location inner_loc(loc.name(), token.unwrap().str());
        const auto datetime = parse_local_datetime(inner_loc);
        if(!datetime || inner_loc.iter() == inner_loc.end())
        {
            throw internal_error(format_underline(
                "toml::parse_offset_datetime: invalid datetime format",
                {{source_location(inner_loc), "date, not datetime"}}),
                source_location(inner_loc));
        }
        time_offset offset(0, 0);
        if(const auto ofs = lex_time_numoffset::invoke(inner_loc))
        {
            const auto str = ofs.unwrap().str();

            const auto hour   = from_string<int>(str.substr(1,2), 0);
            const auto minute = from_string<int>(str.substr(4,2), 0);

            if((hour < 0 || 23 < hour) || (minute < 0 || 59 < minute))
            {
                throw syntax_error(format_underline("toml::parse_offset_datetime: "
                    "invalid offset: it does not conform RFC3339.", {{
                    source_location(loc), "month should be 01-12, day should be"
                    " 01-28,29,30,31, depending on month/year."
                    }}), source_location(inner_loc));
            }

            if(str.front() == '+')
            {
                offset = time_offset(hour, minute);
            }
            else
            {
                offset = time_offset(-hour, -minute);
            }
        }
        else if(*inner_loc.iter() != 'Z' && *inner_loc.iter() != 'z')
        {
            throw internal_error(format_underline(
                "toml::parse_offset_datetime: invalid datetime format",
                {{source_location(inner_loc), "should be `Z` or `+HH:MM`"}}),
                source_location(inner_loc));
        }
        return ok(std::make_pair(offset_datetime(datetime.unwrap().first, offset),
                                 token.unwrap()));
    }
    else
    {
        loc.reset(first);
        return err(format_underline("toml::parse_offset_datetime: ",
            {{source_location(loc), "the next token is not a offset_datetime"}}));
    }
}